

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::ShaderImageLoadStoreBase::IsSSBInVSFSAvailable
          (ShaderImageLoadStoreBase *this,int required)

{
  ostream *poVar1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream reason;
  int local_20;
  GLint blocksFS;
  GLint blocksVS;
  int required_local;
  ShaderImageLoadStoreBase *this_local;
  
  blocksFS = required;
  _blocksVS = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90d6,&local_20);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90da,
             (GLint *)&reason.field_0x174);
  if ((local_20 < blocksFS) || ((int)reason._372_4_ < blocksFS)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar1 = std::operator<<((ostream *)local_1a0,"Required ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,blocksFS);
    poVar1 = std::operator<<(poVar1," VS storage blocks but only ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    poVar1 = std::operator<<(poVar1," available.");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"Required ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,blocksFS);
    poVar1 = std::operator<<(poVar1," FS storage blocks but only ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,reason._372_4_);
    poVar1 = std::operator<<(poVar1," available.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool IsSSBInVSFSAvailable(int required)
	{
		GLint blocksVS, blocksFS;
		glGetIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &blocksVS);
		glGetIntegerv(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, &blocksFS);
		if (blocksVS >= required && blocksFS >= required)
			return true;
		else
		{
			std::ostringstream reason;
			reason << "Required " << required << " VS storage blocks but only " << blocksVS << " available."
				   << std::endl
				   << "Required " << required << " FS storage blocks but only " << blocksFS << " available."
				   << std::endl;
			OutputNotSupported(reason.str());
			return false;
		}
	}